

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.hpp
# Opt level: O2

void __thiscall CLI::AutoTimer::AutoTimer(AutoTimer *this,string *title,time_print_t *time_print)

{
  string sStack_58;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_38;
  
  ::std::__cxx11::string::string((string *)&sStack_58,(string *)title);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function(&local_38,time_print);
  Timer::Timer(&this->super_Timer,&sStack_58,&local_38);
  std::_Function_base::~_Function_base(&local_38.super__Function_base);
  ::std::__cxx11::string::~string((string *)&sStack_58);
  return;
}

Assistant:

AutoTimer(std::string title = "Timer", time_print_t time_print = Simple) : Timer(title, time_print) {}